

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

float Gia_ManDelayTraceLutPrint(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *__ptr;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pvVar2 = p->pLutLib;
  if (pvVar2 == (void *)0x0) {
    iVar11 = Gia_ManLutLevel(p,(int **)0x0);
    fVar14 = (float)iVar11;
  }
  else {
    iVar11 = *(int *)((long)pvVar2 + 8);
    iVar4 = Gia_ManLutSizeMax(p);
    if (iVar11 < iVar4) {
      uVar8 = *(uint *)((long)pvVar2 + 8);
      uVar5 = Gia_ManLutSizeMax(p);
      printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar8,
             (ulong)uVar5);
      return -1e+09;
    }
    fVar14 = 20.0;
  }
  fVar12 = (fVar14 + 1.0) * 4.0;
  uVar6 = (ulong)fVar12;
  __ptr = calloc(1,(long)(fVar12 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6);
  fVar12 = Gia_ManDelayTraceLut(p);
  iVar11 = 1;
  do {
    if (p->nObjs <= iVar11) {
      if (fVerbose != 0) {
        pcVar9 = "LUT library";
        if (pvVar2 == (void *)0x0) {
          pcVar9 = "unit-delay";
        }
        pcVar7 = "%";
        if (pvVar2 == (void *)0x0) {
          pcVar7 = "lev";
        }
        printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar12,pcVar9);
        uVar10 = 0;
        uVar6 = 5;
        uVar8 = 0;
        while ((float)(int)uVar10 < fVar14) {
          uVar8 = uVar8 + *(int *)((long)__ptr + uVar10 * 4);
          uVar10 = uVar10 + 1;
          uVar3 = uVar6;
          if (pvVar2 == (void *)0x0) {
            uVar3 = uVar10;
          }
          iVar11 = Gia_ManLutNum(p);
          printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)uVar8 * 100.0) / (double)iVar11,
                 uVar3 & 0xffffffff,pcVar7,(ulong)uVar8);
          uVar6 = (ulong)((int)uVar6 + 5);
        }
      }
      free(__ptr);
      Gia_ManTimeStop(p);
      return fVar12;
    }
    iVar4 = Gia_ObjIsLut(p,iVar11);
    if ((iVar4 != 0) && (iVar4 = Gia_ObjLutSize(p,iVar11), iVar4 != 0)) {
      fVar13 = Gia_ObjTimeSlack(p,iVar11);
      fVar13 = fVar13 / (fVar12 / fVar14);
      if (fVar13 <= fVar14) {
        if ((fVar13 < 0.0) || (fVar14 < fVar13)) {
          __assert_fail("Num >=0 && Num <= nSteps",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSpeedup.c"
                        ,0x1d6,"float Gia_ManDelayTraceLutPrint(Gia_Man_t *, int)");
        }
        piVar1 = (int *)((long)__ptr + (long)(int)fVar13 * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

float Gia_ManDelayTraceLutPrint( Gia_Man_t * p, int fVerbose )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -ABC_INFINITY;
    }
    // decide how many steps
    nSteps = pLutLib ? 20 : Gia_ManLutLevel(p, NULL);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta   = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p, i) == 0 )
            continue;
        Num = Gia_ObjTimeSlack(p, i) / tDelta;
        if ( Num > nSteps )
            continue;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results    
    if ( fVerbose )
    {
        printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, pLutLib? "LUT library" : "unit-delay" );
        Nodes = 0;
        for ( i = 0; i < nSteps; i++ )
        {
            Nodes += pCounters[i];
            printf( "%3d %s : %5d  (%6.2f %%)\n", pLutLib? 5*(i+1) : i+1, 
                pLutLib? "%":"lev", Nodes, 100.0*Nodes/Gia_ManLutNum(p) );
        }
    }
    ABC_FREE( pCounters );
    Gia_ManTimeStop( p );
    return tArrival;
}